

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O1

void __thiscall JAMA::Eigenvalue<double>::tql2(Eigenvalue<double> *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  double **ppdVar6;
  double *pdVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int k;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int j;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  ulong local_b0;
  double local_a8;
  
  iVar3 = this->n;
  if (1 < (long)iVar3) {
    pdVar4 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    memmove(pdVar4,pdVar4 + 1,(ulong)(iVar3 - 1) << 3);
  }
  (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[(long)iVar3 + -1] = 0.0;
  uVar8 = this->n;
  uVar12 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    uVar11 = 1;
    local_b0 = 2;
    uVar16 = 0;
    dVar27 = 0.0;
    dVar19 = 0.0;
    do {
      pdVar4 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar28 = ABS(pdVar4[uVar16]) +
               ABS((this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16]);
      if (dVar28 <= dVar19) {
        dVar28 = dVar19;
      }
      uVar9 = (uint)uVar12;
      uVar12 = uVar16;
      uVar8 = uVar11;
      if ((int)uVar11 < (int)uVar9) {
        uVar8 = uVar9;
      }
      do {
        if (ABS(pdVar4[uVar12]) <= dVar28 * 2.220446049250313e-16) {
          uVar8 = (uint)uVar12;
          break;
        }
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < (long)(int)uVar9);
      uVar12 = (ulong)uVar8;
      if (uVar16 < uVar12) {
        do {
          pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar19 = pdVar4[uVar16];
          dVar18 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16];
          dVar17 = (pdVar4[uVar16 + 1] - dVar19) / (dVar18 + dVar18);
          dVar18 = hypot(dVar17,1.0);
          pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar17 = (double)((ulong)-dVar18 & -(ulong)(dVar17 < 0.0) |
                           ~-(ulong)(dVar17 < 0.0) & (ulong)dVar18) + dVar17;
          dVar18 = pdVar5[uVar16] / dVar17;
          pdVar4[uVar16] = dVar18;
          dVar17 = dVar17 * pdVar5[uVar16];
          pdVar4[uVar16 + 1] = dVar17;
          dVar19 = dVar19 - dVar18;
          uVar8 = this->n;
          if ((long)(uVar16 + 2) < (long)(int)uVar8) {
            uVar13 = local_b0;
            do {
              pdVar4[uVar13] = pdVar4[uVar13] - dVar19;
              uVar13 = uVar13 + 1;
            } while (uVar8 != uVar13);
          }
          dVar18 = pdVar5[uVar16 + 1];
          dVar29 = 0.0;
          local_a8 = 1.0;
          auVar23 = ZEXT816(0x3ff0000000000000);
          if (uVar16 < uVar12) {
            dVar20 = pdVar4[uVar12];
            uVar13 = uVar12;
            dVar1 = 1.0;
            dVar26 = 1.0;
            dVar24 = 0.0;
            do {
              dVar29 = dVar24;
              local_a8 = dVar1;
              uVar10 = uVar13 - 1;
              dVar1 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar13 - 1];
              dVar25 = dVar26 * dVar1;
              auVar23._0_8_ = hypot(dVar20,dVar1);
              pdVar4 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar4[uVar13] = dVar29 * auVar23._0_8_;
              auVar22._8_8_ = pdVar4[uVar13 - 1];
              auVar22._0_8_ = dVar20;
              auVar23._8_8_ = auVar23._0_8_;
              auVar23 = divpd(auVar22,auVar23);
              pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar1 = pdVar4[uVar13 - 1];
              dVar24 = auVar23._8_8_;
              dVar21 = auVar23._0_8_;
              pdVar4[uVar13] = (dVar21 * dVar25 + dVar24 * dVar1) * dVar24 + dVar20 * dVar26;
              iVar3 = this->n;
              if (0 < (long)iVar3) {
                ppdVar6 = (this->V).data_;
                lVar14 = 0;
                do {
                  pdVar7 = ppdVar6[lVar14];
                  dVar20 = pdVar7[uVar13];
                  dVar2 = pdVar7[uVar10 & 0xffffffff];
                  pdVar7[uVar13] = dVar24 * dVar2 + dVar21 * dVar20;
                  pdVar7[uVar10 & 0xffffffff] = dVar2 * dVar21 + dVar20 * -dVar24;
                  lVar14 = lVar14 + 1;
                } while (iVar3 != lVar14);
              }
              dVar20 = dVar1 * dVar21 - dVar25 * dVar24;
              uVar13 = uVar10;
              dVar1 = dVar26;
              dVar26 = dVar21;
            } while ((long)uVar16 < (long)uVar10);
          }
          dVar27 = dVar27 + dVar19;
          pdVar4 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar17 = (dVar18 * -auVar23._8_8_ * dVar29 * local_a8 * pdVar4[uVar16]) / dVar17;
          pdVar4[uVar16] = auVar23._8_8_ * dVar17;
          (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] = dVar17 * auVar23._0_8_;
        } while (dVar28 * 2.220446049250313e-16 < ABS(pdVar4[uVar16]));
      }
      pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4[uVar16] = pdVar4[uVar16] + dVar27;
      (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16] = 0.0;
      uVar16 = uVar16 + 1;
      uVar8 = this->n;
      uVar12 = (ulong)(int)uVar8;
      uVar11 = uVar11 + 1;
      local_b0 = local_b0 + 1;
      dVar19 = dVar28;
    } while ((long)uVar16 < (long)uVar12);
  }
  if (1 < (int)uVar8) {
    pdVar4 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppdVar6 = (this->V).data_;
    uVar16 = 1;
    uVar12 = 0;
    do {
      uVar15 = uVar12 + 1;
      uVar13 = uVar12 & 0xffffffff;
      uVar10 = uVar16;
      dVar19 = pdVar4[uVar12];
      do {
        if (pdVar4[uVar10] < dVar19) {
          uVar13 = uVar10 & 0xffffffff;
          dVar19 = pdVar4[uVar10];
        }
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
      if (uVar12 != uVar13) {
        pdVar4[(int)uVar13] = pdVar4[uVar12];
        pdVar4[uVar12] = dVar19;
        uVar10 = 0;
        do {
          pdVar7 = ppdVar6[uVar10];
          dVar19 = pdVar7[uVar12];
          pdVar7[uVar12] = pdVar7[uVar13];
          pdVar7[uVar13] = dVar19;
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      uVar16 = uVar16 + 1;
      uVar12 = uVar15;
    } while (uVar15 != uVar8 - 1);
  }
  return;
}

Assistant:

void tql2() {
      //  This is derived from the Algol procedures tql2, by
      //  Bowdler, Martin, Reinsch, and Wilkinson, Handbook for
      //  Auto. Comp., Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      for (int i = 1; i < n; i++) {
        e(i - 1) = e(i);
      }
      e(n - 1) = 0.0;

      Real f    = 0.0;
      Real tst1 = 0.0;
      Real eps  = pow(2.0, -52.0);
      for (int l = 0; l < n; l++) {
        // Find small subdiagonal element

        tst1  = max(tst1, abs(d(l)) + abs(e(l)));
        int m = l;

        // Original while-loop from Java code
        while (m < n) {
          if (abs(e(m)) <= eps * tst1) { break; }
          m++;
        }

        // If m == l, d(l) is an eigenvalue,
        // otherwise, iterate.

        if (m > l) {
          int iter = 0;
          do {
            iter = iter + 1;  // (Could check iteration count here.)

            // Compute implicit shift

            Real g = d(l);
            Real p = (d(l + 1) - g) / (2.0 * e(l));
            Real r = hypot(p, 1.0);
            if (p < 0) { r = -r; }
            d(l)     = e(l) / (p + r);
            d(l + 1) = e(l) * (p + r);
            Real dl1 = d(l + 1);
            Real h   = g - d(l);
            for (int i = l + 2; i < n; i++) {
              d(i) -= h;
            }
            f = f + h;

            // Implicit QL transformation.

            p        = d(m);
            Real c   = 1.0;
            Real c2  = c;
            Real c3  = c;
            Real el1 = e(l + 1);
            Real s   = 0.0;
            Real s2  = 0.0;
            for (int i = m - 1; i >= l; i--) {
              c3       = c2;
              c2       = c;
              s2       = s;
              g        = c * e(i);
              h        = c * p;
              r        = hypot(p, e(i));
              e(i + 1) = s * r;
              s        = e(i) / r;
              c        = p / r;
              p        = c * d(i) - s * g;
              d(i + 1) = h + s * (c * g + s * d(i));

              // Accumulate transformation.

              for (int k = 0; k < n; k++) {
                h           = V(k, i + 1);
                V(k, i + 1) = s * V(k, i) + c * h;
                V(k, i)     = c * V(k, i) - s * h;
              }
            }
            p    = -s * s2 * c3 * el1 * e(l) / dl1;
            e(l) = s * p;
            d(l) = c * p;

            // Check for convergence.

          } while (abs(e(l)) > eps * tst1);
        }
        d(l) = d(l) + f;
        e(l) = 0.0;
      }

      // Sort eigenvalues and corresponding vectors.

      for (int i = 0; i < n - 1; i++) {
        int k  = i;
        Real p = d(i);
        for (int j = i + 1; j < n; j++) {
          if (d(j) < p) {
            k = j;
            p = d(j);
          }
        }
        if (k != i) {
          d(k) = d(i);
          d(i) = p;
          for (int j = 0; j < n; j++) {
            p       = V(j, i);
            V(j, i) = V(j, k);
            V(j, k) = p;
          }
        }
      }
    }